

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall
DescriptorCache::GetCachedDerivedExtPubKey
          (DescriptorCache *this,uint32_t key_exp_pos,uint32_t der_index,CExtPubKey *xpub)

{
  long lVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  long lVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  undefined4 *puVar9;
  CExtPubKey *pCVar10;
  _Hash_node_base *p_Var11;
  __node_base_ptr p_Var12;
  _Hash_node_base *p_Var13;
  long in_FS_OFFSET;
  bool bVar14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (this->m_derived_xpubs)._M_h._M_bucket_count;
  uVar5 = (ulong)key_exp_pos % uVar7;
  p_Var2 = (this->m_derived_xpubs)._M_h._M_buckets[uVar5];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (p_Var12 = p_Var2->_M_nxt, p_Var8 = p_Var2, *(uint32_t *)&p_Var12[1]._M_nxt != key_exp_pos)) {
    while (p_Var6 = p_Var12->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar7 != uVar5) ||
         (p_Var8 = p_Var12, p_Var12 = p_Var6, *(uint *)&p_Var6[1]._M_nxt == key_exp_pos))
      goto LAB_00160edf;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00160edf:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var8->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    bVar14 = false;
  }
  else {
    uVar7 = (ulong)der_index % (ulong)p_Var6[3]._M_nxt;
    p_Var11 = p_Var6[2]._M_nxt[uVar7]._M_nxt;
    p_Var13 = (_Hash_node_base *)0x0;
    if ((p_Var11 != (_Hash_node_base *)0x0) &&
       (p_Var3 = p_Var11->_M_nxt, p_Var13 = p_Var11,
       *(uint32_t *)&p_Var11->_M_nxt[1]._M_nxt != der_index)) {
      while (p_Var11 = p_Var3, p_Var3 = p_Var11->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
        if (((ulong)*(uint *)&p_Var3[1]._M_nxt % (ulong)p_Var6[3]._M_nxt != uVar7) ||
           (p_Var13 = p_Var11, *(uint *)&p_Var3[1]._M_nxt == der_index)) goto LAB_00160f4c;
      }
      p_Var13 = (_Hash_node_base *)0x0;
    }
LAB_00160f4c:
    if (p_Var13 == (_Hash_node_base *)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var13->_M_nxt;
    }
    bVar14 = p_Var6 != (_Hash_node_base *)0x0;
    if (bVar14) {
      puVar9 = (undefined4 *)((long)&p_Var6[1]._M_nxt + 4);
      pCVar10 = xpub;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined4 *)pCVar10->version = *puVar9;
        puVar9 = puVar9 + 1;
        pCVar10 = (CExtPubKey *)&pCVar10->nDepth;
      }
      (xpub->pubkey).vch[0x40] = *(uchar *)((long)&p_Var6[0xf]._M_nxt + 4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar14;
}

Assistant:

bool DescriptorCache::GetCachedDerivedExtPubKey(uint32_t key_exp_pos, uint32_t der_index, CExtPubKey& xpub) const
{
    const auto& key_exp_it = m_derived_xpubs.find(key_exp_pos);
    if (key_exp_it == m_derived_xpubs.end()) return false;
    const auto& der_it = key_exp_it->second.find(der_index);
    if (der_it == key_exp_it->second.end()) return false;
    xpub = der_it->second;
    return true;
}